

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

boolean attack_checks(monst *mtmp,obj *wep,schar dx,schar dy,boolean kicking)

{
  boolean bVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  obj *poVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  boolean call_off_harm;
  obj *obj;
  char qbuf [128];
  boolean kicking_local;
  schar dy_local;
  schar dx_local;
  obj *wep_local;
  monst *mtmp_local;
  
  mtmp->mstrategy = mtmp->mstrategy & 0xcfffffff;
  if (((u._1052_1_ & 1) != 0) && (mtmp == u.ustuck)) {
    return '\0';
  }
  if (flags.forcefight != '\0') {
    return '\0';
  }
  qbuf[0x7d] = kicking;
  qbuf[0x7e] = dy;
  qbuf[0x7f] = dx;
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
        (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))))))
    goto LAB_00319847;
LAB_003198d4:
    if ((((((mtmp->data->mflags1 & 0x10000) != 0) ||
          ((poVar5 = which_armor(mtmp,4), poVar5 != (obj *)0x0 &&
           (poVar5 = which_armor(mtmp,4), poVar5->otyp == 0x4f)))) ||
         ((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            (((((u.uprops[0x19].intrinsic == 0 &&
                ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
               (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
             (u.uprops[0x19].blocked != 0)))))) &&
          (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
           (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar4)))))) &&
        (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
         ((bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0' &&
          ((bVar1 = warning_at((int)u.ux + (int)qbuf[0x7f],(int)u.uy + (int)qbuf[0x7e]),
           bVar1 == '\0' &&
           ((*(uint *)&level->locations[(int)u.ux + (int)qbuf[0x7f]][(int)u.uy + (int)qbuf[0x7e]].
                       field_0x6 >> 3 & 1) == 0)))))))) &&
       ((((u.uprops[0x1e].intrinsic != 0 ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
        (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 || ((mtmp->data->mflags1 & 0x80) == 0)))))) {
      pline("Wait!  There\'s something there you can\'t see!");
      map_invisible(u.ux + qbuf[0x7f],u.uy + qbuf[0x7e]);
      if ((((mtmp->m_ap_type != '\0') && (u.uprops[0x17].intrinsic == 0)) &&
          (u.uprops[0x17].extrinsic == 0)) &&
         (((u.ustuck == (monst *)0x0 && ((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) == 0)) &&
          (bVar1 = dmgtype(mtmp->data,0x13), bVar1 != '\0')))) {
        u.ustuck = mtmp;
      }
      wakeup(mtmp);
      return '\x01';
    }
  }
  else {
    bVar1 = worm_known(level,mtmp);
    if (bVar1 == '\0') goto LAB_003198d4;
LAB_00319847:
    if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_003198d4;
  }
  if (((((mtmp->m_ap_type != '\0') && (u.uprops[0x17].intrinsic == 0)) &&
       (u.uprops[0x17].extrinsic == 0)) &&
      ((((mtmp->data->mflags1 & 0x10000) != 0 ||
        ((poVar5 = which_armor(mtmp,4), poVar5 != (obj *)0x0 &&
         (poVar5 = which_armor(mtmp,4), poVar5->otyp == 0x4f)))) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
         (((((u.uprops[0x19].intrinsic == 0 &&
             ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
            (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
          (u.uprops[0x19].blocked != 0)))) &&
        (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
         (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar4)))))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      ((bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0' &&
       (bVar1 = warning_at((int)u.ux + (int)qbuf[0x7f],(int)u.uy + (int)qbuf[0x7e]), bVar1 == '\0'))
      )))) {
    if ((*(uint *)&level->locations[mtmp->mx][mtmp->my].field_0x6 >> 3 & 1) != 0) {
      seemimic(mtmp);
      return '\0';
    }
    stumble_onto_mimic(mtmp,qbuf[0x7f],qbuf[0x7e]);
    return '\x01';
  }
  if ((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0031a0a7;
      if ((((((u.uprops[0x1e].intrinsic == 0) &&
             ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
          ((u.uprops[0x40].intrinsic != 0 ||
           ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
         ((mtmp->data->mflags3 & 0x200) != 0)) {
        bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
        goto joined_r0x0031a0a1;
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
joined_r0x0031a0a1:
      if (bVar2 != 0) {
LAB_0031a0a7:
        if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
           ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0))))
        goto LAB_0031a47a;
      }
    }
    bVar1 = warning_at((int)u.ux + (int)qbuf[0x7f],(int)u.uy + (int)qbuf[0x7e]);
    if ((bVar1 == '\0') && (((mtmp->data->mflags1 & 0x80) != 0 || (mtmp->data->mlet == '9')))) {
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffffff7f;
      newsym((int)mtmp->mx,(int)mtmp->my);
      if ((*(uint *)&level->locations[mtmp->mx][mtmp->my].field_0x6 >> 3 & 1) != 0) {
        seemimic(mtmp);
        return '\0';
      }
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        if (u.uprops[0x19].extrinsic == 0) goto LAB_0031a338;
      }
      else if (((u.uprops[0x19].intrinsic == 0) && (u.uprops[0x19].extrinsic == 0)) &&
              ((youmonst.data != mons + 0x1e &&
               ((youmonst.data != mons + 0x31 && (youmonst.data != mons + 0x32))))))
      goto LAB_0031a338;
      if (u.uprops[0x19].blocked != 0) {
LAB_0031a338:
        if ((((u.uprops[0x1e].intrinsic == 0) &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           ((bVar1 = is_pool(level,(int)mtmp->mx,(int)mtmp->my), bVar1 == '\0' ||
            (((byte)u._1052_1_ >> 1 & 1) != 0)))) {
          poVar5 = level->objects[mtmp->mx][mtmp->my];
          if (poVar5 != (obj *)0x0) {
            pcVar7 = l_monnam(mtmp);
            pcVar7 = an(pcVar7);
            pcVar6 = doname(poVar5);
            pline("Wait!  There\'s %s hiding under %s!",pcVar7,pcVar6);
          }
        }
        else {
          pline("Wait!  There\'s a hidden monster there!");
        }
        return '\x01';
      }
    }
  }
LAB_0031a47a:
  if ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0) || (mtmp->m_ap_type != '\0')) &&
     (((((mtmp->data->mflags1 & 0x10000) == 0 &&
        ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
         (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) &&
       ((((u.uprops[0x1e].intrinsic != 0 ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
           ((((u.uprops[0x19].intrinsic != 0 ||
              ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
             (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))) &&
          (u.uprops[0x19].blocked == 0)))) ||
        (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
         (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41)))))) ||
      (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
       (bVar1 = match_warn_of_mon(mtmp), bVar1 != '\0')))))) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffffff7f;
    wakeup(mtmp);
  }
  if (flags.safe_peaceful == 'n') {
    return '\0';
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
    return '\0';
  }
  if (u.uprops[0x1c].intrinsic != 0) {
    return '\0';
  }
  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
    if (u.umonnum == u.umonster) {
      return '\0';
    }
    bVar1 = dmgtype(youmonst.data,0x24);
    if (bVar1 == '\0') {
      return '\0';
    }
  }
  if (u.uprops[0x1b].intrinsic != 0) {
    return '\0';
  }
  if (u.umonnum == 0x9e) {
    return '\0';
  }
  if ((youmonst.data)->mlet == '\x1c') {
    return '\0';
  }
  if ((wep != (obj *)0x0) && (wep->oartifact == '\x03')) {
    override_confirmation = '\x01';
    return '\0';
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0031a8de;
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((mtmp->data->mflags3 & 0x200) != 0)))) {
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x0031a8d8;
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
joined_r0x0031a8d8:
    if (bVar2 != 0) {
LAB_0031a8de:
      if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0))))
      goto LAB_0031ab32;
    }
  }
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar5 = which_armor(mtmp,4), poVar5 != (obj *)0x0 &&
        (poVar5 = which_armor(mtmp,4), poVar5->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         (((((u.uprops[0x19].intrinsic == 0 &&
             ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
            (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
          (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar4)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0')))) {
    return '\0';
  }
LAB_0031ab32:
  bVar8 = false;
  if ((flags.safe_peaceful == 'y') && (qbuf[0x7d] == '\0')) {
    pcVar7 = mon_nam(mtmp);
    pline("You stop for %s.",pcVar7);
    bVar8 = true;
  }
  else if ((flags.safe_peaceful == 'a') || ((flags.safe_peaceful == 'y' && (qbuf[0x7d] != '\0')))) {
    pcVar7 = mon_nam(mtmp);
    sprintf((char *)&obj,"Really attack %s?",pcVar7);
    cVar3 = paranoid_yn((char *)&obj,iflags.paranoid_hit);
    bVar8 = cVar3 != 'y';
  }
  if (bVar8) {
    flags.move = '\0';
    return '\x01';
  }
  return '\0';
}

Assistant:

boolean attack_checks(struct monst *mtmp,
		      struct obj *wep,/* uwep for attack(), null for kick_monster() */
		      schar dx, schar dy,
		      boolean kicking)
{
	char qbuf[QBUFSZ];

	/* if you're close enough to attack, alert any waiting monster */
	mtmp->mstrategy &= ~STRAT_WAITMASK;

	if (u.uswallow && mtmp == u.ustuck) return FALSE;

	if (flags.forcefight) {
		/* Do this in the caller, after we checked that the monster
		 * didn't die from the blow.  Reason: putting the 'I' there
		 * causes the hero to forget the square's contents since
		 * both 'I' and remembered contents are stored in .glyph.
		 * If the monster dies immediately from the blow, the 'I' will
		 * not stay there, so the player will have suddenly forgotten
		 * the square's contents for no apparent reason.
		if (!canspotmon(mtmp) &&
		    !level->locations[u.ux+u.dx][u.uy+u.dy].mem_invis)
			map_invisible(u.ux+u.dx, u.uy+u.dy);
		 */
		return FALSE;
	}

	/* Put up an invisible monster marker, but with exceptions for
	 * monsters that hide and monsters you've been warned about.
	 * The former already prints a warning message and
	 * prevents you from hitting the monster just via the hidden monster
	 * code below; if we also did that here, similar behavior would be
	 * happening two turns in a row.  The latter shows a glyph on
	 * the screen, so you know something is there.
	 */
	if (!canspotmon(level, mtmp) &&
		    !warning_at(u.ux+dx, u.uy+dy) &&
		    !level->locations[u.ux+dx][u.uy+dy].mem_invis &&
		    !(!Blind && mtmp->mundetected && hides_under(mtmp->data))) {
		pline("Wait!  There's something there you can't see!");
		map_invisible(u.ux+dx, u.uy+dy);
		/* if it was an invisible mimic, treat it as if we stumbled
		 * onto a visible mimic
		 */
		if (mtmp->m_ap_type && !Protection_from_shape_changers) {
		    if (!u.ustuck && !mtmp->mflee && dmgtype(mtmp->data,AD_STCK))
			u.ustuck = mtmp;
		}
		wakeup(mtmp); /* always necessary; also un-mimics mimics */
		return TRUE;
	}

	if (mtmp->m_ap_type && !Protection_from_shape_changers &&
	   !sensemon(mtmp) &&
	   !warning_at(u.ux+dx, u.uy+dy)) {
		/* If a hidden mimic was in a square where a player remembers
		 * some (probably different) unseen monster, the player is in
		 * luck--he attacks it even though it's hidden.
		 */
		if (level->locations[mtmp->mx][mtmp->my].mem_invis) {
		    seemimic(mtmp);
		    return FALSE;
		}
		stumble_onto_mimic(mtmp, dx, dy);
		return TRUE;
	}

	if (mtmp->mundetected && !canseemon(level, mtmp) &&
		!warning_at(u.ux+dx, u.uy+dy) &&
		(hides_under(mtmp->data) || mtmp->data->mlet == S_EEL)) {
	    mtmp->mundetected = mtmp->msleeping = 0;
	    newsym(mtmp->mx, mtmp->my);
	    if (level->locations[mtmp->mx][mtmp->my].mem_invis) {
		seemimic(mtmp);
		return FALSE;
	    }
	    if (!(Blind ? Blind_telepat : Unblind_telepat)) {
		struct obj *obj;

		if (Blind || (is_pool(level, mtmp->mx,mtmp->my) && !Underwater))
		    pline("Wait!  There's a hidden monster there!");
		else if ((obj = level->objects[mtmp->mx][mtmp->my]) != 0)
		    pline("Wait!  There's %s hiding under %s!",
			  an(l_monnam(mtmp)), doname(obj));
		return TRUE;
	    }
	}

	/*
	 * make sure to wake up a monster from the above cases if the
	 * hero can sense that the monster is there.
	 */
	if ((mtmp->mundetected || mtmp->m_ap_type) && sensemon(mtmp)) {
	    mtmp->mundetected = 0;
	    wakeup(mtmp);
	}

	if (flags.safe_peaceful != 'n' && mtmp->mpeaceful
	    && !Confusion && !Hallucination && !Stunned) {
		/* Intelligent chaotic weapons (Stormbringer) want blood */
		if (wep && wep->oartifact == ART_STORMBRINGER) {
			override_confirmation = TRUE;
			return FALSE;
		}
		if (canspotmon(level, mtmp)) {
			boolean call_off_harm = FALSE;
			if (flags.safe_peaceful == 'y' && !kicking) {
				pline("You stop for %s.", mon_nam(mtmp));
				call_off_harm = TRUE;
			} else if (flags.safe_peaceful == 'a' ||
				   (flags.safe_peaceful == 'y' && kicking)) {
				sprintf(qbuf, "Really attack %s?", mon_nam(mtmp));
				if (paranoid_yn(qbuf, iflags.paranoid_hit) != 'y')
					call_off_harm = TRUE;
			}
			if (call_off_harm) {
				flags.move = 0;
				return TRUE;
			}
		}
	}

	return FALSE;
}